

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_59e0::ktxStreamTest_CanCreateAutoKtxFromCppStream_Test::
ktxStreamTest_CanCreateAutoKtxFromCppStream_Test
          (ktxStreamTest_CanCreateAutoKtxFromCppStream_Test *this)

{
  ktxStreamTest *in_RDI;
  
  ktxStreamTest::ktxStreamTest(in_RDI);
  (in_RDI->super_Test)._vptr_Test =
       (_func_int **)&PTR__ktxStreamTest_CanCreateAutoKtxFromCppStream_Test_00191938;
  return;
}

Assistant:

TEST_F(ktxStreamTest, CanCreateAutoKtxFromCppStream)
{
    StreambufStream ktxStream{std::move(_ktx2Streambuf), std::ios::in}; // Or could use the KTx1, no difference
    KtxTexture<ktxTexture> texture;

    KTX_error_code err = ktxTexture_CreateFromStream(ktxStream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, texture.pHandle());
    EXPECT_EQ(err, KTX_SUCCESS) << "Failed to create auto-detected KTX from C++ stream: " << ktxErrorString(err);
    ASSERT_NE(texture, nullptr) << "Newly-created auto-detected KTX is null";
    EXPECT_TRUE(ktxStream.destructed()) << "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)";
}